

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefFunc * __thiscall wasm::Builder::makeRefFunc(Builder *this,Name func,HeapType heapType)

{
  Type TVar1;
  Type local_38;
  Type local_30;
  RefFunc *ret;
  Builder *this_local;
  HeapType heapType_local;
  Name func_local;
  
  heapType_local.id = func.super_IString.str._M_len;
  ret = (RefFunc *)this;
  this_local = (Builder *)heapType.id;
  local_30.id = (uintptr_t)MixedArena::alloc<wasm::RefFunc>((MixedArena *)(this->wasm + 0x158));
  Name::operator=(&((RefFunc *)local_30.id)->func,(Name *)&heapType_local);
  TVar1.id = local_30.id;
  wasm::Type::Type(&local_38,(HeapType)this_local,NonNullable);
  wasm::RefFunc::finalize(TVar1);
  return (RefFunc *)local_30.id;
}

Assistant:

RefFunc* makeRefFunc(Name func, HeapType heapType) {
    auto* ret = wasm.allocator.alloc<RefFunc>();
    ret->func = func;
    ret->finalize(Type(heapType, NonNullable));
    return ret;
  }